

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembleList<double>::TPZDohrAssembleList
          (TPZDohrAssembleList<double> *this,int numitems,TPZFMatrix<double> *output,
          TPZAutoPointer<TPZDohrAssembly<double>_> *assembly)

{
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  TPZAutoPointer<TPZDohrAssembly<double>_> *in_stack_ffffffffffffff98;
  TPZSemaphore *this_00;
  
  *in_RDI = in_ESI;
  this_00 = (TPZSemaphore *)(in_RDI + 2);
  TPZSemaphore::TPZSemaphore(this_00);
  *(undefined8 *)(in_RDI + 0x1e) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x1a) = 0;
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  *(undefined8 *)(in_RDI + 0x22) = 0;
  std::mutex::mutex((mutex *)0x1fc84d6);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x2a) = 0;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  *(undefined8 *)(in_RDI + 0x2c) = 0;
  std::mutex::mutex((mutex *)0x1fc8508);
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrAssembleItem<double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrAssembleItem<double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<double>_>_>_>
          *)0x1fc851e);
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)this_00,in_stack_ffffffffffffff98);
  *(undefined8 *)(in_RDI + 0x36) = in_RDX;
  return;
}

Assistant:

TPZDohrAssembleList<TVar>::TPZDohrAssembleList(int numitems, TPZFMatrix<TVar> &output, TPZAutoPointer<TPZDohrAssembly<TVar> > assembly) : fNumItems(numitems),
fAssembleIndexes(assembly), fOutput(&output), fAssemblyLock(), fListAccessLock()
{
}